

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O2

void nni_posix_udp_cb(void *arg,uint events)

{
  nni_list *list;
  nni_iov *pnVar1;
  nni_plat_udp *pnVar2;
  nng_err nVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  nni_aio *pnVar7;
  nni_sockaddr *pnVar8;
  size_t sVar9;
  ssize_t sVar10;
  int *piVar11;
  uint events_00;
  long lVar12;
  undefined1 local_198 [8];
  sockaddr_storage ss;
  iovec iov [8];
  nni_iov *local_50;
  nng_iov *aiov;
  nni_plat_udp *local_40;
  uint local_34 [2];
  uint niov;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x70));
  aiov._4_4_ = events;
  local_40 = (nni_plat_udp *)arg;
  if ((events & 1) != 0) {
    while( true ) {
      pnVar2 = local_40;
      pnVar7 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x40));
      if (pnVar7 == (nni_aio *)0x0) break;
      nni_aio_get_iov(pnVar7,local_34,&local_50);
      if (8 < local_34[0]) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                  ,0x90,"niov <= NNI_AIO_MAX_IOV");
      }
      pnVar1 = local_50;
      uVar6 = (ulong)local_34[0];
      for (lVar12 = 0; uVar6 << 4 != lVar12; lVar12 = lVar12 + 0x10) {
        *(undefined8 *)(ss.__ss_padding + lVar12 + 0x76) =
             *(undefined8 *)((long)&pnVar1->iov_buf + lVar12);
        *(undefined8 *)((long)&iov[0].iov_base + lVar12) =
             *(undefined8 *)((long)&pnVar1->iov_len + lVar12);
      }
      iov[7].iov_len = (size_t)local_198;
      sVar10 = recvmsg(pnVar2->udp_fd,(msghdr *)&iov[7].iov_len,0);
      if ((int)sVar10 < 0) {
        piVar11 = __errno_location();
        if (*piVar11 == 0xb) break;
        nVar3 = nni_plat_errno(*piVar11);
      }
      else {
        pnVar8 = (nni_sockaddr *)nni_aio_get_input(pnVar7,0);
        nVar3 = NNG_OK;
        if (pnVar8 != (nni_sockaddr *)0x0) {
          nni_posix_sockaddr2nn(pnVar8,local_198,0x80);
          nVar3 = NNG_OK;
        }
      }
      nni_list_remove((nni_list *)((long)arg + 0x40),pnVar7);
      nni_aio_finish(pnVar7,nVar3,(long)(int)sVar10);
    }
  }
  if ((aiov._4_4_ & 4) != 0) {
    list = &local_40->udp_sendq;
    while( true ) {
      pnVar7 = (nni_aio *)nni_list_first(list);
      if (pnVar7 == (nni_aio *)0x0) break;
      nni_aio_get_iov(pnVar7,local_34,&local_50);
      if (8 < local_34[0]) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                  ,0xdd,"niov <= NNI_AIO_MAX_IOV");
      }
      pnVar8 = (nni_sockaddr *)nni_aio_get_input(pnVar7,0);
      sVar9 = nni_posix_nn2sockaddr(local_198,pnVar8);
      pnVar1 = local_50;
      if ((int)sVar9 < 1) {
        nVar3 = NNG_EADDRINVAL;
        sVar9 = 0;
      }
      else {
        uVar6 = (ulong)local_34[0];
        for (lVar12 = 0; uVar6 << 4 != lVar12; lVar12 = lVar12 + 0x10) {
          *(undefined8 *)(ss.__ss_padding + lVar12 + 0x76) =
               *(undefined8 *)((long)&pnVar1->iov_buf + lVar12);
          *(undefined8 *)((long)&iov[0].iov_base + lVar12) =
               *(undefined8 *)((long)&pnVar1->iov_len + lVar12);
        }
        iov[7].iov_len = (size_t)local_198;
        sVar10 = sendmsg(local_40->udp_fd,(msghdr *)&iov[7].iov_len,0x4000);
        nVar3 = NNG_OK;
        if ((int)sVar10 < 0) {
          piVar11 = __errno_location();
          if (*piVar11 == 0xb) break;
          nVar3 = nni_plat_errno(*piVar11);
        }
        sVar9 = (size_t)(int)sVar10;
      }
      nni_list_remove(list,pnVar7);
      nni_aio_finish(pnVar7,nVar3,sVar9);
    }
  }
  pnVar2 = local_40;
  if ((aiov._4_4_ & 0x38) == 0) {
    iVar4 = nni_list_empty(&local_40->udp_sendq);
    iVar5 = nni_list_empty(&pnVar2->udp_recvq);
    events_00 = (uint)(iVar5 == 0) | (uint)(iVar4 == 0) << 2;
    if (events_00 != 0) {
      iVar4 = nni_posix_pfd_arm(&pnVar2->udp_pfd,events_00);
      if (iVar4 != 0) {
        nni_posix_udp_doerror(pnVar2,iVar4);
      }
    }
  }
  else {
    nni_posix_udp_doclose(local_40);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x70));
  return;
}

Assistant:

static void
nni_posix_udp_cb(void *arg, unsigned events)
{
	nni_plat_udp *udp = arg;

	nni_mtx_lock(&udp->udp_mtx);
	if (events & NNI_POLL_IN) {
		nni_posix_udp_dorecv(udp);
	}
	if (events & NNI_POLL_OUT) {
		nni_posix_udp_dosend(udp);
	}
	if (events & (NNI_POLL_HUP | NNI_POLL_ERR | NNI_POLL_INVAL)) {
		nni_posix_udp_doclose(udp);
	} else {
		events = 0;
		if (!nni_list_empty(&udp->udp_sendq)) {
			events |= NNI_POLL_OUT;
		}
		if (!nni_list_empty(&udp->udp_recvq)) {
			events |= NNI_POLL_IN;
		}
		if (events) {
			int rv;
			rv = nni_posix_pfd_arm(&udp->udp_pfd, events);
			if (rv != 0) {
				nni_posix_udp_doerror(udp, rv);
			}
		}
	}
	nni_mtx_unlock(&udp->udp_mtx);
}